

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

void bidiag_orth(double *A,int M,int N,double *U,double *V)

{
  double *x_00;
  double *v_00;
  double *A_00;
  double *C;
  int iVar1;
  double dVar2;
  double beta;
  double *w;
  double *AT;
  double *v;
  double *x;
  int local_38;
  int t;
  int u;
  int k;
  int i;
  int j;
  double *V_local;
  double *U_local;
  int N_local;
  int M_local;
  double *A_local;
  
  if (N <= M) {
    x_00 = (double *)malloc((long)M << 3);
    v_00 = (double *)malloc((long)M << 3);
    A_00 = (double *)malloc((long)M * 8 * (long)M);
    C = (double *)malloc((long)M * 8 * (long)M);
    eye(U,M);
    eye(V,N);
    for (k = 0; k < N; k = k + 1) {
      for (u = k; u < M; u = u + 1) {
        x_00[u - k] = A[u * N + k];
      }
      dVar2 = house(x_00,M - k,v_00);
      for (u = k; u < M; u = u + 1) {
        local_38 = 0;
        for (t = k; t < N; t = t + 1) {
          A_00[(local_38 + u) - k] = A[t + u * N];
          local_38 = (M - k) + local_38;
        }
      }
      mmult(A_00,v_00,C,N - k,M - k,1);
      scale(C,N - k,1,dVar2);
      mmult(v_00,C,A_00,M - k,1,N - k);
      for (u = k; iVar1 = k, u < M; u = u + 1) {
        for (t = k; t < N; t = t + 1) {
          iVar1 = u * N + t;
          A[iVar1] = A[iVar1] - A_00[((u - k) * (N - k) + t) - k];
        }
      }
      while (u = iVar1 + 1, u < M) {
        A[u * N + k] = v_00[u - k];
        iVar1 = u;
      }
      for (u = k; u < M; u = u + 1) {
        for (t = k; t < M; t = t + 1) {
          A_00[((u - k) * (M - k) + t) - k] = U[t + u * M];
        }
      }
      mmult(A_00,v_00,C,M - k,M - k,1);
      scale(C,M - k,1,dVar2);
      mmult(C,v_00,A_00,M - k,1,M - k);
      for (u = k; u < M; u = u + 1) {
        for (t = k; t < M; t = t + 1) {
          iVar1 = t + u * M;
          U[iVar1] = U[iVar1] - A_00[((u - k) * (M - k) + t) - k];
        }
      }
      u = k;
      if (k < N + -2) {
        while (u = u + 1, u < N) {
          x_00[(u - k) + -1] = A[k * N + u];
        }
        dVar2 = house(x_00,(N - k) + -1,v_00);
        for (u = k; u < M; u = u + 1) {
          t = k;
          while (t = t + 1, t < N) {
            A_00[(((u - k) * ((N - k) + -1) + t) - k) + -1] = A[t + u * N];
          }
        }
        mmult(A_00,v_00,C,M - k,(N - k) + -1,1);
        scale(C,M - k,1,dVar2);
        mmult(C,v_00,A_00,M - k,1,(N - k) + -1);
        for (u = k; u < M; u = u + 1) {
          t = k;
          while (t = t + 1, t < N) {
            iVar1 = t + u * N;
            A[iVar1] = A[iVar1] - A_00[(((u - k) * ((N - k) + -1) + t) - k) + -1];
          }
        }
        local_38 = 1;
        for (u = k + 2; u < N; u = u + 1) {
          A[k * N + u] = v_00[local_38];
          local_38 = local_38 + 1;
        }
      }
    }
    free(x_00);
    free(v_00);
    free(A_00);
    return;
  }
  printf("M should be greater than or equal to N");
  exit(1);
}

Assistant:

void bidiag_orth(double *A, int M, int N,double *U,double *V) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;

	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * M);
	w = (double*) malloc(sizeof(double) * M * M);


	eye(U,M);
	eye(V,N);

	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];

		}

		beta = house(x,M-j,v);
		//mdisplay(v,M-j,1);

		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);

			}

		}


		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}

		for(i=j+1;i < M;++i) {
			A[i*N+j] = v[i-j];
		}


		for (i=j; i < M; i++) {
			t = i * M;
			u = (i-j) *(M-j);
			for (k=j; k < M; k++) {
				AT[u+k-j] = U[k+t];
			}
		}

		mmult(AT,v,w,M-j,M-j,1);
		scale(w,M-j,1,beta);
		mmult(w,v,AT,M-j,1,M-j);

		for (i=j; i < M; i++) {
			t = i * M;
			u = (i-j) *(M-j);
			for (k=j; k < M; k++) {
				U[k+t] -= AT[u+k-j];
			}
		}

		//mdisplay(U,M,M);

		if (j < N - 2) {
			for(i=j+1;i < N;++i) {
				x[i-j-1] = A[j*N+i];
			}
			beta = house(x,N-j-1,v);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					AT[u+k-j-1] = A[k+t];
				}
			}

			mmult(AT,v,w,M-j,N-j-1,1);
			scale(w,M-j,1,beta);
			mmult(w,v,AT,M-j,1,N-j-1);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					A[k+t] -= AT[u+k-j-1];
				}
			}
			u = 1;
			t = j*N;
			for(i = j + 2; i < N;++i) {
				A[t+i] = v[u];
				u++;
			}

		}

	}


	free(x);
	free(v);
	free(AT);

}